

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

trie_node trie_node_insert(trie t,trie_node parent,trie_key key,trie_value value)

{
  long lVar1;
  int iVar2;
  set s;
  set psVar3;
  undefined8 *puVar4;
  trie_value in_RCX;
  trie_key in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  trie_node n;
  size_t iterator;
  size_t capacity;
  void *node_list;
  trie_node_free_conflict node_free;
  trie_node_ref child_ref;
  trie_node child;
  set_cb_compare in_stack_ffffffffffffffa0;
  set_cb_hash in_stack_ffffffffffffffa8;
  ulong uVar5;
  void *in_stack_ffffffffffffffb8;
  undefined8 *in_stack_ffffffffffffffc0;
  trie_node local_30;
  trie_node local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) || (in_RDX == (trie_key)0x0)) {
    log_write_impl_va("metacall",0xe3,"trie_node_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                      ,3,"Trie invalid node insertion parameters");
    local_8 = (trie_node)0x0;
  }
  else {
    s = (set)malloc(0x10);
    if (s == (set)0x0) {
      log_write_impl_va("metacall",0xec,"trie_node_insert",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,3,"Trie node insert bad reference node allocation");
      local_8 = (trie_node)0x0;
    }
    else {
      s->count = (size_t)in_RDX;
      if (*(long *)(in_RSI + 0x20) == 0) {
        psVar3 = set_create(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        *(set *)(in_RSI + 0x20) = psVar3;
        if (*(long *)(in_RSI + 0x20) == 0) {
          log_write_impl_va("metacall",0xf9,"trie_node_insert",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,3,"Trie invalid child set allocation");
          free(s);
          return (trie_node)0x0;
        }
      }
      if (in_RDI[4] == 0) {
        if ((ulong)in_RDI[3] <= in_RDI[2] + 1) {
          lVar1 = in_RDI[3];
          in_stack_ffffffffffffffb8 = realloc((void *)in_RDI[1],lVar1 * 0x50);
          if (in_stack_ffffffffffffffb8 == (void *)0x0) {
            log_write_impl_va("metacall",0x11d,"trie_node_insert",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                              ,3,"Trie bad node list reallocation");
            free(s);
            return (trie_node)0x0;
          }
          in_RDI[1] = in_stack_ffffffffffffffb8;
          in_RDI[3] = lVar1 * 2;
          *in_RDI = in_RDI[1];
          uVar5 = in_RDI[2];
          while (uVar5 = uVar5 + 1, uVar5 < (ulong)in_RDI[3]) {
            puVar4 = (undefined8 *)(in_RDI[1] + uVar5 * 0x28);
            *puVar4 = 0;
            puVar4[1] = 0;
            puVar4[2] = 0;
            puVar4[3] = 0;
            puVar4[4] = 0;
          }
        }
        s->capacity = in_RDI[2];
        local_30 = (trie_node)(in_RDI[1] + s->capacity * 0x28);
        in_RDI[2] = in_RDI[2] + 1;
      }
      else {
        in_stack_ffffffffffffffc0 = (undefined8 *)in_RDI[4];
        in_RDI[4] = *in_stack_ffffffffffffffc0;
        s->capacity = in_stack_ffffffffffffffc0[1];
        local_30 = (trie_node)(in_RDI[1] + s->capacity * 0x28);
        free(in_stack_ffffffffffffffc0);
        in_RDI[2] = in_RDI[2] + 1;
      }
      if (local_30 == (trie_node)0x0) {
        free(s);
        local_8 = (trie_node)0x0;
      }
      else {
        iVar2 = set_insert(s,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (iVar2 == 0) {
          local_30->parent_index = *(size_t *)(in_RSI + 8);
          local_30->self_index = s->capacity;
          local_30->key = in_RDX;
          local_30->value = in_RCX;
          local_30->childs = (set)0x0;
          local_8 = local_30;
        }
        else {
          log_write_impl_va("metacall",0x141,"trie_node_insert",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,3,"Trie invalid child insertion");
          free(s);
          local_8 = (trie_node)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

trie_node trie_node_insert(trie t, trie_node parent, trie_key key, trie_value value)
{
	trie_node child;
	trie_node_ref child_ref;

	if (t == NULL || parent == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion parameters");

		return NULL;
	}

	child_ref = malloc(sizeof(struct trie_node_ref_type));

	if (child_ref == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie node insert bad reference node allocation");

		return NULL;
	}

	child_ref->key = key;

	if (parent->childs == NULL)
	{
		parent->childs = set_create(t->hash_cb, t->compare_cb);

		if (parent->childs == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child set allocation");

			free(child_ref);

			return NULL;
		}
	}

	if (t->free_node_list != NULL)
	{
		trie_node_free node_free = t->free_node_list;

		t->free_node_list = node_free->next;

		child_ref->index = node_free->index;

		child = &t->node_list[child_ref->index];

		free(node_free);

		++t->size;
	}
	else
	{
		if ((t->size + 1) >= t->capacity)
		{
			register void *node_list;

			size_t capacity = t->capacity << 1;

			size_t iterator;

			node_list = realloc(t->node_list, capacity * sizeof(struct trie_node_type));

			if (node_list == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list reallocation");

				free(child_ref);

				return NULL;
			}

			t->node_list = node_list;

			t->capacity = capacity;

			t->root = &t->node_list[0];

			for (iterator = t->size + 1; iterator < t->capacity; ++iterator)
			{
				trie_node n = &t->node_list[iterator];

				n->parent_index = 0;
				n->self_index = 0;
				n->key = NULL;
				n->value = NULL;
				n->childs = NULL;
			}
		}

		child_ref->index = t->size;

		child = &t->node_list[child_ref->index];

		++t->size;
	}

	if (child != NULL)
	{
		if (set_insert(parent->childs, key, child_ref) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child insertion");

			free(child_ref);

			return NULL;
		}

		child->parent_index = parent->self_index;
		child->self_index = child_ref->index;
		child->key = key;
		child->value = value;
		child->childs = NULL;

		return child;
	}

	free(child_ref);

	return NULL;
}